

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringIterator.cpp
# Opt level: O0

Var Js::JavascriptStringIterator::EntryNext(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  char16 c;
  char16 cVar3;
  int n;
  CallFlags e;
  charcount_t cVar4;
  charcount_t cVar5;
  ScriptContext *pSVar6;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar7;
  JavascriptString **ppJVar8;
  DynamicObject *pDVar9;
  JavascriptLibrary *this_00;
  CharStringCache *this_01;
  JavascriptString *local_90;
  Var result;
  nullptr_t pvStack_80;
  char16 chFirst;
  uint local_78;
  charcount_t local_74;
  charcount_t index;
  charcount_t length;
  JavascriptString *string;
  JavascriptStringIterator *iterator;
  Var thisObj;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar6 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar6);
  pSVar6 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar6,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptStringIterator.cpp"
                                ,0x15,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  library = (JavascriptLibrary *)RecyclableObject::GetScriptContext(function);
  thisObj = ScriptContext::GetLibrary((ScriptContext *)library);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptStringIterator.cpp"
                                ,0x19,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  iterator = (JavascriptStringIterator *)Arguments::operator[]((Arguments *)&scriptContext,0);
  bVar2 = VarIs<Js::JavascriptStringIterator>(iterator);
  if (!bVar2) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)library,-0x7ff5ebf1,L"String Iterator.prototype.next");
  }
  string = (JavascriptString *)VarTo<Js::JavascriptStringIterator>(iterator);
  ppJVar8 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptString__
                      ((WriteBarrierPtr *)&((JavascriptStringIterator *)string)->m_string);
  _index = *ppJVar8;
  if (_index == (JavascriptString *)0x0) {
    pDVar9 = JavascriptLibrary::CreateIteratorResultObjectDone((JavascriptLibrary *)thisObj);
    return pDVar9;
  }
  local_74 = JavascriptString::GetLength(_index);
  local_78 = *(uint *)&string[1].super_RecyclableObject.type.ptr;
  if (local_74 <= local_78) {
    pvStack_80 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
              ((WriteBarrierPtr<Js::JavascriptString> *)(string + 1),&stack0xffffffffffffff80);
    pDVar9 = JavascriptLibrary::CreateIteratorResultObjectDone((JavascriptLibrary *)thisObj);
    return pDVar9;
  }
  c = JavascriptString::GetItem(_index,local_78);
  cVar4 = local_78 + 1;
  cVar5 = JavascriptString::GetLength(_index);
  if ((cVar4 != cVar5) && (bVar2 = NumberUtilities::IsSurrogateLowerPart((uint)(ushort)c), bVar2)) {
    cVar3 = JavascriptString::GetItem(_index,local_78 + 1);
    bVar2 = NumberUtilities::IsSurrogateUpperPart((uint)(ushort)cVar3);
    if (bVar2) {
      local_90 = (JavascriptString *)
                 JavascriptString::SubstringCore(_index,local_78,2,(ScriptContext *)library);
      *(int *)&string[1].super_RecyclableObject.type.ptr =
           *(int *)&string[1].super_RecyclableObject.type.ptr + 2;
      goto LAB_01334fdc;
    }
  }
  this_00 = ScriptContext::GetLibrary((ScriptContext *)library);
  this_01 = JavascriptLibrary::GetCharStringCache(this_00);
  local_90 = CharStringCache::GetStringForChar(this_01,c);
  *(int *)&string[1].super_RecyclableObject.type.ptr =
       *(int *)&string[1].super_RecyclableObject.type.ptr + 1;
LAB_01334fdc:
  pDVar9 = JavascriptLibrary::CreateIteratorResultObject
                     ((JavascriptLibrary *)thisObj,local_90,false);
  return pDVar9;
}

Assistant:

Var JavascriptStringIterator::EntryNext(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        Assert(!(callInfo.Flags & CallFlags_New));

        Var thisObj = args[0];

        if (!VarIs<JavascriptStringIterator>(thisObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedStringIterator, _u("String Iterator.prototype.next"));
        }

        JavascriptStringIterator* iterator = VarTo<JavascriptStringIterator>(thisObj);
        JavascriptString* string = iterator->m_string;

        if (string == nullptr)
        {
            return library->CreateIteratorResultObjectDone();
        }

        charcount_t length = string->GetLength();
        charcount_t index = iterator->m_nextIndex;

        if (index >= length)
        {
            // Nulling out the m_string field is important so that the iterator
            // does not keep the string alive after iteration is completed.
            iterator->m_string = nullptr;
            return library->CreateIteratorResultObjectDone();
        }

        char16 chFirst = string->GetItem(index);
        Var result;

        if (index + 1 == string->GetLength() ||
            !NumberUtilities::IsSurrogateLowerPart(chFirst) ||
            !NumberUtilities::IsSurrogateUpperPart(string->GetItem(index + 1)))
        {
            result = scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(chFirst);
            iterator->m_nextIndex += 1;
        }
        else
        {
            result = JavascriptString::SubstringCore(string, index, 2, scriptContext);
            iterator->m_nextIndex += 2;
        }

        return library->CreateIteratorResultObject(result);
    }